

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O3

void __thiscall
Assimp::LWO::AnimResolver::AnimResolver
          (AnimResolver *this,
          list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *_envelopes,
          double tick)

{
  double dVar1;
  double dVar2;
  long lVar3;
  _List_node_base *p_Var4;
  Envelope **ppEVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  
  this->envelopes = _envelopes;
  this->flags = 0;
  this->sample_delta = 0.0;
  this->sample_rate = 0.0;
  this->trans_x = (Envelope *)0x0;
  this->trans_y = (Envelope *)0x0;
  this->trans_z = (Envelope *)0x0;
  this->rotat_x = (Envelope *)0x0;
  this->rotat_y = (Envelope *)0x0;
  this->rotat_z = (Envelope *)0x0;
  this->scale_x = (Envelope *)0x0;
  this->scale_y = (Envelope *)0x0;
  this->scale_z = (Envelope *)0x0;
  this->envl_x = (Envelope *)0x0;
  this->envl_y = (Envelope *)0x0;
  this->envl_z = (Envelope *)0x0;
  (this->cur_x)._M_current = (Key *)0x0;
  (this->cur_y)._M_current = (Key *)0x0;
  (this->cur_z)._M_current = (Key *)0x0;
  *(undefined4 *)((long)&(this->cur_z)._M_current + 7) = 0;
  this->first = 150392.0;
  this->last = 150392.0;
  p_Var4 = (_envelopes->
           super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)_envelopes) {
    do {
      lVar6 = *(long *)((long)(p_Var4 + 1 + 1) + 8);
      lVar3 = *(long *)(p_Var4 + 1 + 1);
      p_Var4[3]._M_prev = (_List_node_base *)0x0;
      *(long *)(p_Var4 + 3 + 1) = (lVar6 - lVar3 >> 3) * -0x3333333333333333 + -1;
      if (lVar6 != lVar3) {
        ppEVar5 = &this->trans_x;
        switch(*(undefined4 *)((long)&p_Var4[1]._M_next + 4)) {
        case 1:
          break;
        case 2:
          ppEVar5 = &this->trans_y;
          break;
        case 3:
          ppEVar5 = &this->trans_z;
          break;
        case 4:
          ppEVar5 = &this->rotat_x;
          break;
        case 5:
          ppEVar5 = &this->rotat_y;
          break;
        case 6:
          ppEVar5 = &this->rotat_z;
          break;
        case 7:
          ppEVar5 = &this->scale_x;
          break;
        case 8:
          ppEVar5 = &this->scale_y;
          break;
        case 9:
          ppEVar5 = &this->scale_z;
          break;
        default:
          goto switchD_006ab867_default;
        }
        *ppEVar5 = (Envelope *)(p_Var4 + 1);
        lVar6 = *(long *)(p_Var4 + 1 + 1);
        if (lVar6 != *(long *)((long)(p_Var4 + 1 + 1) + 8)) {
          do {
            *(double *)lVar6 = *(double *)lVar6 * tick;
            lVar6 = lVar6 + 0x28;
          } while (lVar6 != *(long *)((long)(p_Var4 + 1 + 1) + 8));
          lVar6 = *(long *)(p_Var4 + 1 + 1);
        }
        dVar1 = *(double *)lVar6;
        uVar7 = SUB84(dVar1,0);
        uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
        dVar2 = this->first;
        if (dVar2 <= dVar1) {
          uVar7 = SUB84(dVar2,0);
          uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
        }
        this->first = (double)CONCAT44(uVar8,uVar7);
        dVar1 = *(double *)(*(long *)((long)(p_Var4 + 1 + 1) + 8) + -0x28);
        uVar7 = SUB84(dVar1,0);
        uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
        dVar2 = this->last;
        if (dVar1 <= dVar2) {
          uVar7 = SUB84(dVar2,0);
          uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
        }
        this->last = (double)CONCAT44(uVar8,uVar7);
      }
switchD_006ab867_default:
      p_Var4 = (((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)this->envelopes);
  }
  this->need_to_setup = true;
  return;
}

Assistant:

AnimResolver::AnimResolver(std::list<Envelope>& _envelopes,double tick)
    : envelopes   (_envelopes)
    , sample_rate (0.)
    , envl_x(), envl_y(), envl_z()
    , end_x(), end_y(), end_z()
    , flags()
    , sample_delta()
{
    trans_x = trans_y = trans_z = NULL;
    rotat_x = rotat_y = rotat_z = NULL;
    scale_x = scale_y = scale_z = NULL;

    first = last = 150392.;

    // find transformation envelopes
    for (std::list<LWO::Envelope>::iterator it = envelopes.begin(); it != envelopes.end(); ++it) {

        (*it).old_first = 0;
        (*it).old_last  = (*it).keys.size()-1;

        if ((*it).keys.empty()) continue;
        switch ((*it).type) {

            // translation
            case LWO::EnvelopeType_Position_X:
                trans_x = &*it;break;
            case LWO::EnvelopeType_Position_Y:
                trans_y = &*it;break;
            case LWO::EnvelopeType_Position_Z:
                trans_z = &*it;break;

                // rotation
            case LWO::EnvelopeType_Rotation_Heading:
                rotat_x = &*it;break;
            case LWO::EnvelopeType_Rotation_Pitch:
                rotat_y = &*it;break;
            case LWO::EnvelopeType_Rotation_Bank:
                rotat_z = &*it;break;

                // scaling
            case LWO::EnvelopeType_Scaling_X:
                scale_x = &*it;break;
            case LWO::EnvelopeType_Scaling_Y:
                scale_y = &*it;break;
            case LWO::EnvelopeType_Scaling_Z:
                scale_z = &*it;break;
            default:
                continue;
        };

        // convert from seconds to ticks
        for (std::vector<LWO::Key>::iterator d = (*it).keys.begin(); d != (*it).keys.end(); ++d)
            (*d).time *= tick;

        // set default animation range (minimum and maximum time value for which we have a keyframe)
        first = std::min(first, (*it).keys.front().time );
        last  = std::max(last,  (*it).keys.back().time );
    }

    // deferred setup of animation range to increase performance.
    // typically the application will want to specify its own.
    need_to_setup = true;
}